

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

void N_VScale_Serial(sunrealtype c,N_Vector x,N_Vector z)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  sunindextype N;
  long lVar4;
  long lVar5;
  
  if (z == x) {
    lVar1 = *x->content;
    if (0 < lVar1) {
      lVar2 = *(long *)((long)x->content + 0x10);
      lVar4 = 0;
      do {
        *(double *)(lVar2 + lVar4 * 8) = *(double *)(lVar2 + lVar4 * 8) * c;
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
  }
  else if ((c != 1.0) || (NAN(c))) {
    plVar3 = (long *)x->content;
    if ((c != -1.0) || (NAN(c))) {
      lVar1 = *plVar3;
      if (0 < lVar1) {
        lVar2 = plVar3[2];
        lVar4 = *(long *)((long)z->content + 0x10);
        lVar5 = 0;
        do {
          *(double *)(lVar4 + lVar5 * 8) = *(double *)(lVar2 + lVar5 * 8) * c;
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
    }
    else {
      lVar1 = *plVar3;
      if (0 < lVar1) {
        lVar2 = plVar3[2];
        lVar4 = *(long *)((long)z->content + 0x10);
        lVar5 = 0;
        do {
          *(ulong *)(lVar4 + lVar5 * 8) = *(ulong *)(lVar2 + lVar5 * 8) ^ 0x8000000000000000;
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
    }
  }
  else {
    lVar1 = *x->content;
    if (0 < lVar1) {
      lVar2 = *(long *)((long)x->content + 0x10);
      lVar4 = *(long *)((long)z->content + 0x10);
      lVar5 = 0;
      do {
        *(undefined8 *)(lVar4 + lVar5 * 8) = *(undefined8 *)(lVar2 + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
  }
  return;
}

Assistant:

void N_VScale_Serial(sunrealtype c, N_Vector x, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;

  xd = zd = NULL;

  if (z == x)
  { /* BLAS usage: scale x <- cx */
    VScaleBy_Serial(c, x);
    return;
  }

  if (c == ONE) { VCopy_Serial(x, z); }
  else if (c == -ONE) { VNeg_Serial(x, z); }
  else
  {
    N  = NV_LENGTH_S(x);
    xd = NV_DATA_S(x);
    zd = NV_DATA_S(z);
    for (i = 0; i < N; i++) { zd[i] = c * xd[i]; }
  }

  return;
}